

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry_impl.hpp
# Opt level: O1

bean_ptr<Person> *
hiberlite::Registry<Person>::createBeanPtr
          (bean_ptr<Person> *__return_storage_ptr__,bean_key *key,Person *obj)

{
  int *piVar1;
  long lVar2;
  real_bean<Person> *prVar3;
  shared_cnt_obj_pair<hiberlite::real_bean<Person>_> *psVar4;
  iterator iVar5;
  mapped_type *pprVar6;
  logic_error *this;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar7;
  
  lVar2 = key->id;
  if (lVar2 == -1) {
    psVar7 = (key->con).res;
    if (psVar7 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<Person>_>).res =
           (shared_cnt_obj_pair<hiberlite::real_bean<Person>_> *)0x0;
      (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<Person>_>)._vptr_shared_res =
           (_func_int **)&PTR__shared_res_001997e8;
      return __return_storage_ptr__;
    }
    psVar7->refCount = psVar7->refCount + 1;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<Person>_>).res =
         (shared_cnt_obj_pair<hiberlite::real_bean<Person>_> *)0x0;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<Person>_>)._vptr_shared_res =
         (_func_int **)&PTR__shared_res_001997e8;
  }
  else {
    prVar3 = (real_bean<Person> *)operator_new(0x28);
    psVar7 = (key->con).res;
    if (psVar7 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (prVar3->key).id = lVar2;
      (prVar3->key).con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      (prVar3->key).con.res = (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0;
    }
    else {
      psVar7->refCount = psVar7->refCount + 1;
      (prVar3->key).id = lVar2;
      (prVar3->key).con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      (prVar3->key).con.res = psVar7;
      psVar7->refCount = psVar7->refCount + 1;
    }
    prVar3->obj = obj;
    prVar3->forgotten = false;
    if (psVar7 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      piVar1 = &psVar7->refCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*psVar7->_vptr_shared_cnt_obj_pair[1])();
      }
    }
    psVar4 = (shared_cnt_obj_pair<hiberlite::real_bean<Person>_> *)operator_new(0x18);
    psVar4->res = prVar3;
    psVar4->refCount = 0;
    ((shared_cnt_obj_pair<hiberlite::real_bean<Person>_> *)&psVar4->_vptr_shared_cnt_obj_pair)->
    _vptr_shared_cnt_obj_pair = (_func_int **)&PTR__rb_pair_00199820;
    iVar5 = std::
            _Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
            ::find((_Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
                    *)rbpairs,key);
    if (iVar5._M_node != (_Base_ptr)(rbpairs + 8)) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"bean already exists");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pprVar6 = std::
              map<hiberlite::bean_key,_hiberlite::rb_pair<Person>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
              ::operator[]((map<hiberlite::bean_key,_hiberlite::rb_pair<Person>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
                            *)rbpairs,key);
    *pprVar6 = (mapped_type)psVar4;
    psVar7 = (key->con).res;
    if (psVar7 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<Person>_>)._vptr_shared_res =
           (_func_int **)&PTR__shared_res_001997e8;
      (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<Person>_>).res = psVar4;
      psVar4->refCount = psVar4->refCount + 1;
      return __return_storage_ptr__;
    }
    psVar7->refCount = psVar7->refCount + 1;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<Person>_>)._vptr_shared_res =
         (_func_int **)&PTR__shared_res_001997e8;
    psVar4->refCount = psVar4->refCount + 1;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<Person>_>).res = psVar4;
  }
  piVar1 = &psVar7->refCount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*psVar7->_vptr_shared_cnt_obj_pair[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Registry<C>::createBeanPtr(bean_key key, C* obj)
{
	if(key.id==Database::NULL_ID)
		return bean_ptr<C>(key,NULL);

	real_bean<C>* rb=new real_bean<C>(key,obj);
	rb_pair<C>* para=new rb_pair<C>(rb);

	if( rbpairs.find(key)!=rbpairs.end() )
		throw std::logic_error("bean already exists");

	rbpairs[key]=para;

	bean_ptr<C> ans(key, para);
	return ans;
}